

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int EVP_PKEY_set1_encoded_public_key(EVP_PKEY *pkey,uchar *pub,size_t publen)

{
  int iVar1;
  ulong in_RDX;
  EVP_PKEY *in_RSI;
  long in_RDI;
  size_t in_stack_00000080;
  uchar *in_stack_00000088;
  char *in_stack_00000090;
  EVP_PKEY *in_stack_00000098;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x60) == 0)) {
    if (in_RDX < 0x80000000) {
      iVar1 = evp_pkey_asn1_ctrl(in_RSI,(int)(in_RDX >> 0x20),(int)in_RDX,in_stack_ffffffffffffffd8)
      ;
      if (iVar1 < 1) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = EVP_PKEY_set_octet_string_param
                        (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_set1_encoded_public_key(EVP_PKEY *pkey, const unsigned char *pub,
                                     size_t publen)
{
    if (pkey != NULL && evp_pkey_is_provided(pkey))
        return
            EVP_PKEY_set_octet_string_param(pkey,
                                            OSSL_PKEY_PARAM_ENCODED_PUBLIC_KEY,
                                            (unsigned char *)pub, publen);

    if (publen > INT_MAX)
        return 0;
    /* Historically this function was EVP_PKEY_set1_tls_encodedpoint */
    if (evp_pkey_asn1_ctrl(pkey, ASN1_PKEY_CTRL_SET1_TLS_ENCPT, publen,
                           (void *)pub) <= 0)
        return 0;
    return 1;
}